

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

Ch __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_false>
::TakePush(NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_false>
           *this)

{
  SizeType *pSVar1;
  char cVar2;
  Ch CVar3;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *this_00;
  char *pcVar4;
  
  cVar2 = *((this->
            super_NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_false,_false>
            ).is)->current_;
  pcVar4 = internal::Stack<rapidjson::CrtAllocator>::Push<char>((this->stackStream).stack_,1);
  *pcVar4 = cVar2;
  pSVar1 = &(this->stackStream).length_;
  *pSVar1 = *pSVar1 + 1;
  this_00 = (this->
            super_NumberStream<rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>,_false,_false>
            ).is;
  CVar3 = *this_00->current_;
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(this_00);
  return CVar3;
}

Assistant:

CEREAL_RAPIDJSON_FORCEINLINE Ch TakePush() {
            stackStream.Put(static_cast<char>(Base::is.Peek()));
            return Base::is.Take();
        }